

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O0

bool __thiscall
mprpc::MpRpcServer::send_error_rsp
          (MpRpcServer *this,shared_ptr<mprpc::ClientConnection> *conn,
          shared_ptr<mprpc::MpRpcMessage> *req,int error,string *err_msg)

{
  element_type *peVar1;
  uint64_t uVar2;
  ssize_t sVar3;
  int __flags;
  shared_ptr<mprpc::ClientConnection> local_a0;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_90;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
  local_88;
  duration<long,_std::ratio<1L,_1000000L>_> local_80;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
  local_78;
  duration<long,_std::ratio<1L,_1000000L>_> local_70 [3];
  undefined1 local_58 [8];
  MsgPackPacker pk;
  string *err_msg_local;
  int error_local;
  shared_ptr<mprpc::MpRpcMessage> *req_local;
  shared_ptr<mprpc::ClientConnection> *conn_local;
  MpRpcServer *this_local;
  
  __flags = (int)err_msg;
  pk.pk.callback = (msgpack_packer_write)err_msg;
  MsgPackPacker::MsgPackPacker((MsgPackPacker *)local_58);
  MsgPackPacker::pack_map((MsgPackPacker *)local_58,4);
  peVar1 = std::__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)req);
  MsgPackPacker::pack_map_item((MsgPackPacker *)local_58,"id",peVar1->id);
  peVar1 = std::__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)req);
  MsgPackPacker::pack_map_item((MsgPackPacker *)local_58,"method",&peVar1->method);
  MsgPackPacker::pack_string((MsgPackPacker *)local_58,"error",0);
  MsgPackPacker::pack_map((MsgPackPacker *)local_58,2);
  MsgPackPacker::pack_map_item((MsgPackPacker *)local_58,"code",error);
  MsgPackPacker::pack_map_item((MsgPackPacker *)local_58,"message",(string *)pk.pk.callback);
  MsgPackPacker::pack_string((MsgPackPacker *)local_58,"debug",0);
  MsgPackPacker::pack_map((MsgPackPacker *)local_58,2);
  peVar1 = std::__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)req);
  local_78.__d.__r =
       (duration)
       std::chrono::
       time_point_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                 (&peVar1->recv_time);
  local_70[0].__r =
       (rep)std::chrono::
            time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
            ::time_since_epoch(&local_78);
  uVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(local_70);
  MsgPackPacker::pack_map_item((MsgPackPacker *)local_58,"recv_time",uVar2);
  local_90.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_88.__d.__r =
       (duration)
       std::chrono::
       time_point_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                 (&local_90);
  local_80.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
                      ::time_since_epoch(&local_88);
  uVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_80);
  MsgPackPacker::pack_map_item((MsgPackPacker *)local_58,"send_time",uVar2);
  std::shared_ptr<mprpc::ClientConnection>::shared_ptr(&local_a0,conn);
  sVar3 = send(this,(int)&local_a0,(void *)pk.sb.size,(size_t)local_58,__flags);
  std::shared_ptr<mprpc::ClientConnection>::~shared_ptr(&local_a0);
  MsgPackPacker::~MsgPackPacker((MsgPackPacker *)local_58);
  return (bool)((byte)sVar3 & 1);
}

Assistant:

bool MpRpcServer::send_error_rsp(shared_ptr<mprpc::ClientConnection> conn,
                                    shared_ptr<mprpc::MpRpcMessage> req,
                                    int error,
                                    const string& err_msg)
    {
        MsgPackPacker pk;
        pk.pack_map(4);

        pk.pack_map_item("id", req->id);
        pk.pack_map_item("method", req->method);

        pk.pack_string("error");
        pk.pack_map(2);
        pk.pack_map_item("code", error);
        pk.pack_map_item("message", err_msg);

        pk.pack_string("debug");
        pk.pack_map(2);
        pk.pack_map_item("recv_time", (uint64_t)time_point_cast<microseconds>(req->recv_time).time_since_epoch().count());
        pk.pack_map_item("send_time", (uint64_t)time_point_cast<microseconds>(system_clock::now()).time_since_epoch().count());

        return send(conn, pk.sb.data, pk.sb.size);
    }